

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Util.cpp
# Opt level: O3

string * __thiscall
Centaurus::readmbsfromfile_abi_cxx11_(string *__return_storage_ptr__,Centaurus *this,char *filename)

{
  undefined8 uVar1;
  ifstream ifs;
  long local_218 [29];
  undefined8 auStack_130 [36];
  
  std::ifstream::ifstream(local_218,(char *)this,_S_in);
  uVar1 = *(undefined8 *)((long)auStack_130 + *(long *)(local_218[0] + -0x18));
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<std::istreambuf_iterator<char,std::char_traits<char>>>
            ((string *)__return_storage_ptr__,uVar1,0xffffffff,0,0xffffffff);
  std::ifstream::~ifstream(local_218);
  return __return_storage_ptr__;
}

Assistant:

std::string readmbsfromfile(const char *filename)
{
	std::ifstream ifs(filename);

	return std::string(std::istreambuf_iterator<char>(ifs), {});
}